

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_tri2_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  REF_INT RVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  REF_INT cell;
  REF_INT local [27];
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 != 0) {
    uVar16 = (ulong)uVar3;
    pcVar13 = "create";
    uVar6 = 0x1a1;
    goto LAB_0012cfe1;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  iVar9 = ref_mpi->n;
  iVar4 = ref_mpi->id;
  iVar7 = 0;
  iVar12 = (int)(3 / (long)iVar9);
  iVar14 = iVar12 * iVar9;
  if (3 < iVar14) {
    iVar7 = ((((iVar9 + 3) / iVar9) * (iVar14 + -4)) / iVar12 - iVar14) + 4;
  }
  if (iVar4 == iVar7) {
LAB_0012c65b:
    uVar3 = ref_node_add(ref_node,0,local);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "add node";
      uVar6 = 0x1b1;
      goto LAB_0012cfe1;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar5 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar5 = ref_node->global[lVar11];
    }
    iVar9 = ref_mpi->n;
    iVar4 = (iVar9 + 3) / iVar9;
    if (lVar5 / (long)iVar4 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar5 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      RVar10 = (REF_INT)(lVar5 / (long)iVar4);
    }
    else {
      lVar5 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      iVar12 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar12;
      RVar10 = iVar9 + (int)((lVar5 - iVar4 * iVar9) / (long)iVar12);
    }
    ref_node->part[lVar11] = RVar10;
    uVar3 = ref_node_add(ref_node,1,local + 1);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "add node";
      uVar6 = 0x1b2;
      goto LAB_0012cfe1;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar5 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar5 = ref_node->global[lVar11];
    }
    iVar9 = ref_mpi->n;
    iVar4 = (iVar9 + 3) / iVar9;
    if (lVar5 / (long)iVar4 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar5 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      RVar10 = (REF_INT)(lVar5 / (long)iVar4);
    }
    else {
      lVar5 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      iVar12 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar12;
      RVar10 = iVar9 + (int)((lVar5 - iVar4 * iVar9) / (long)iVar12);
    }
    ref_node->part[lVar11] = RVar10;
    uVar3 = ref_node_add(ref_node,2,local + 2);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "add node";
      uVar6 = 0x1b3;
      goto LAB_0012cfe1;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar11 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar5 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar5 = ref_node->global[lVar11];
    }
    iVar9 = ref_mpi->n;
    iVar4 = (iVar9 + 3) / iVar9;
    if (lVar5 / (long)iVar4 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar5 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      RVar10 = (REF_INT)(lVar5 / (long)iVar4);
    }
    else {
      lVar5 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      iVar12 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar12;
      RVar10 = iVar9 + (int)((lVar5 - iVar4 * iVar9) / (long)iVar12);
    }
    ref_node->part[lVar11] = RVar10;
    uVar3 = ref_cell_add(pRVar1->cell[3],local,&cell);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "add tri";
      uVar6 = 0x1b5;
      goto LAB_0012cfe1;
    }
    iVar9 = ref_mpi->n;
    iVar4 = ref_mpi->id;
    iVar12 = (int)(3 / (long)iVar9);
    iVar14 = iVar12 * iVar9;
  }
  else {
    iVar8 = (iVar9 + 3) / iVar9;
    iVar7 = 0;
    if (iVar8 + 1U < 3) {
      iVar7 = iVar8;
    }
    iVar15 = 4 - iVar14;
    if (iVar15 <= iVar7) {
      iVar7 = (1 - iVar8 * iVar15) / iVar12 + iVar15;
    }
    if (iVar4 == iVar7) goto LAB_0012c65b;
    iVar7 = (int)(2 / (long)iVar8);
    if (iVar15 <= iVar7) {
      iVar7 = (2 - iVar8 * iVar15) / iVar12 + iVar15;
    }
    if (iVar4 == iVar7) goto LAB_0012c65b;
  }
  iVar7 = 0;
  if (3 < iVar14) {
    iVar7 = ((((iVar9 + 3) / iVar9) * (iVar14 + -4)) / iVar12 - iVar14) + 4;
  }
  if (iVar4 == iVar7) {
LAB_0012ca63:
    uVar3 = ref_node_add(ref_node,0,local);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "add node";
      uVar6 = 0x1c2;
      goto LAB_0012cfe1;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    lVar5 = -1;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar5 = ref_node->global[lVar11];
    }
    iVar9 = ref_mpi->n;
    iVar4 = (iVar9 + 3) / iVar9;
    if (lVar5 / (long)iVar4 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar5 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      RVar10 = (REF_INT)(lVar5 / (long)iVar4);
    }
    else {
      lVar5 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      iVar12 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar12;
      RVar10 = iVar9 + (int)((lVar5 - iVar4 * iVar9) / (long)iVar12);
    }
    ref_node->part[lVar11] = RVar10;
    uVar3 = ref_node_add(ref_node,3,local + 1);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "add node";
      uVar6 = 0x1c3;
      goto LAB_0012cfe1;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf] = -1.0;
    pRVar2 = pRVar2 + lVar11 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar5 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar5 = ref_node->global[lVar11];
    }
    iVar9 = ref_mpi->n;
    iVar4 = (iVar9 + 3) / iVar9;
    if (lVar5 / (long)iVar4 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar5 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      RVar10 = (REF_INT)(lVar5 / (long)iVar4);
    }
    else {
      lVar5 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      iVar12 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar12;
      RVar10 = iVar9 + (int)((lVar5 - iVar4 * iVar9) / (long)iVar12);
    }
    ref_node->part[lVar11] = RVar10;
    uVar3 = ref_node_add(ref_node,1,local + 2);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "add node";
      uVar6 = 0x1c4;
      goto LAB_0012cfe1;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar5 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar5 = ref_node->global[lVar11];
    }
    iVar9 = ref_mpi->n;
    iVar4 = (iVar9 + 3) / iVar9;
    if (lVar5 / (long)iVar4 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar5 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      RVar10 = (REF_INT)(lVar5 / (long)iVar4);
    }
    else {
      lVar5 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar5 = ref_node->global[lVar11];
        }
      }
      iVar12 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar12;
      RVar10 = iVar9 + (int)((lVar5 - iVar4 * iVar9) / (long)iVar12);
    }
    ref_node->part[lVar11] = RVar10;
    uVar3 = ref_cell_add(pRVar1->cell[3],local,&cell);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "add tri";
      uVar6 = 0x1c6;
      goto LAB_0012cfe1;
    }
  }
  else {
    iVar9 = (iVar9 + 3) / iVar9;
    iVar7 = (int)(3 / (long)iVar9);
    iVar14 = 4 - iVar14;
    if (iVar14 <= iVar7) {
      iVar7 = (3 - iVar9 * iVar14) / iVar12 + iVar14;
    }
    if (iVar4 == iVar7) goto LAB_0012ca63;
    iVar7 = 0;
    if (iVar9 + 1U < 3) {
      iVar7 = iVar9;
    }
    if (iVar14 <= iVar7) {
      iVar7 = (1 - iVar9 * iVar14) / iVar12 + iVar14;
    }
    if (iVar4 == iVar7) goto LAB_0012ca63;
  }
  uVar3 = ref_node_initialize_n_global(ref_node,4);
  if (uVar3 != 0) {
    uVar16 = (ulong)uVar3;
    pcVar13 = "init glob";
    uVar6 = 0x1c9;
    goto LAB_0012cfe1;
  }
  iVar9 = ref_mpi->n;
  iVar4 = ref_mpi->id;
  iVar14 = 0;
  iVar7 = (int)(3 / (long)iVar9);
  iVar12 = iVar7 * iVar9;
  if (3 < iVar12) {
    iVar14 = ((((iVar9 + 3) / iVar9) * (iVar12 + -4)) / iVar7 - iVar12) + 4;
  }
  if (iVar4 == iVar14) {
LAB_0012ce7d:
    uVar3 = ref_node_local(ref_node,0,local);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "loc";
      uVar6 = 0x1d2;
      goto LAB_0012cfe1;
    }
    uVar3 = ref_node_local(ref_node,2,local + 1);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "loc";
      uVar6 = 0x1d3;
      goto LAB_0012cfe1;
    }
    local[2] = 10;
    uVar3 = ref_cell_add(pRVar1->cell[0],local,&cell);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar13 = "add edg";
      uVar6 = 0x1d5;
      goto LAB_0012cfe1;
    }
    iVar12 = ref_mpi->n;
    iVar4 = ref_mpi->id;
    iVar9 = (iVar12 + 3) / iVar12;
    iVar7 = (int)(3 / (long)iVar12);
    iVar12 = iVar7 * iVar12;
    iVar8 = 4 - iVar12;
  }
  else {
    iVar9 = (iVar9 + 3) / iVar9;
    iVar14 = (int)(2 / (long)iVar9);
    iVar8 = 4 - iVar12;
    if (iVar8 <= iVar14) {
      iVar14 = (2 - iVar9 * iVar8) / iVar7 + iVar8;
    }
    if (iVar4 == iVar14) goto LAB_0012ce7d;
  }
  iVar14 = (int)(3 / (long)iVar9);
  if (iVar8 <= iVar14) {
    iVar14 = (3 - iVar8 * iVar9) / iVar7 + iVar8;
  }
  if (iVar4 != iVar14) {
    iVar14 = 0;
    if (3 < iVar12) {
      iVar14 = (((iVar12 + -4) * iVar9) / iVar7 - iVar12) + 4;
    }
    if (iVar4 != iVar14) {
      return 0;
    }
  }
  uVar3 = ref_node_local(ref_node,3,local);
  if (uVar3 == 0) {
    uVar3 = ref_node_local(ref_node,0,local + 1);
    if (uVar3 == 0) {
      local[2] = 10;
      uVar3 = ref_cell_add(pRVar1->cell[0],local,&cell);
      if (uVar3 == 0) {
        return 0;
      }
      pcVar13 = "add edg";
      uVar6 = 0x1e2;
    }
    else {
      pcVar13 = "loc";
      uVar6 = 0x1e0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar6
           ,"ref_fixture_tri2_grid",(ulong)uVar3,pcVar13);
    return uVar3;
  }
  uVar16 = (ulong)uVar3;
  pcVar13 = "loc";
  uVar6 = 0x1df;
LAB_0012cfe1:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar6,
         "ref_fixture_tri2_grid",uVar16,pcVar13);
  return (REF_STATUS)uVar16;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri2_grid(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 4;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 3;
  global[2] = 1;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, -1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 2;
  global[2] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[2] = global[2];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  global[0] = 3;
  global[1] = 0;
  global[2] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[2] = global[2];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}